

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringSerialiser.cpp
# Opt level: O1

void __thiscall
Utility::StringSerialiser::StringSerialiser
          (StringSerialiser *this,string *source,bool use_linefeed_only)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined3 in_register_00000011;
  size_type sVar4;
  bool bVar5;
  
  (this->input_string_)._M_dataplus._M_p = (pointer)&(this->input_string_).field_2;
  (this->input_string_)._M_string_length = 0;
  (this->input_string_).field_2._M_local_buf[0] = '\0';
  this->input_string_pointer_ = 0;
  if (CONCAT31(in_register_00000011,use_linefeed_only) == 0) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  else {
    std::__cxx11::string::reserve((ulong)this);
    sVar2 = source->_M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (source->_M_dataplus)._M_p;
      sVar4 = 0;
      bVar5 = false;
      do {
        cVar1 = pcVar3[sVar4];
        if (!(bool)(cVar1 == '\n' & bVar5)) {
          std::__cxx11::string::push_back((char)this);
        }
        bVar5 = cVar1 == '\r';
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  return;
}

Assistant:

StringSerialiser::StringSerialiser(const std::string &source, bool use_linefeed_only) {
	if(!use_linefeed_only) {
		input_string_ = source;
	} else {
		input_string_.reserve(source.size());

		// Commute any \ns that are not immediately after \rs to \rs; remove the rest.
		bool saw_carriage_return = false;
		for(auto character: source) {
			if(character != '\n') {
				input_string_.push_back(character);
			} else {
				if(!saw_carriage_return) {
					input_string_.push_back('\r');
				}
			}
			saw_carriage_return = character == '\r';
		}
	}
}